

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_strided_put(Integer g_a,Integer *lo,Integer *hi,Integer *skip,void *buf,Integer *ld)

{
  long *plVar1;
  short sVar2;
  long lVar3;
  Integer *__src;
  int iVar4;
  Integer IVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long ndim;
  long lVar12;
  char *dst_ptr;
  int proc;
  char *prem;
  Integer *blo;
  Integer *bhi;
  Integer nstride;
  Integer plo [7];
  int stride_rem [14];
  Integer phi [7];
  int stride_loc [14];
  int count [14];
  Integer ldrem [7];
  _iterator_hdl it_hdl;
  int local_4fc;
  uint local_4f8;
  int local_4f4;
  Integer *local_4f0;
  ulong local_4e8;
  Integer *local_4e0;
  char *local_4d8;
  Integer *local_4d0;
  Integer *local_4c8;
  long local_4c0;
  void *local_4b8;
  int local_4b0 [2];
  long local_4a8 [8];
  int local_468 [16];
  Integer local_428 [8];
  int local_3e8;
  int aiStack_3e4 [15];
  int local_3a8 [16];
  Integer local_368 [7];
  _iterator_hdl local_330;
  
  local_4f4 = GA[g_a + 1000].elemsize;
  sVar2 = GA[g_a + 1000].ndim;
  uVar10 = (uint)sVar2;
  local_4f0 = hi;
  local_4e0 = lo;
  local_4b8 = buf;
  pnga_nnodes();
  local_4c0 = (long)GA[g_a + 1000].p_handle;
  local_4e8 = (ulong)uVar10;
  local_4f8 = uVar10;
  if (0 < sVar2) {
    uVar11 = 0;
    do {
      if (skip[uVar11] < 1) {
        pnga_error("nga_strided_put: Invalid value of skip along coordinate ",uVar11);
      }
      uVar11 = uVar11 + 1;
    } while (local_4e8 != uVar11);
  }
  gai_iterator_init(g_a,local_4e0,local_4f0,&local_330);
  iVar4 = gai_iterator_next(&local_330,&local_4fc,&local_4d0,&local_4c8,&local_4d8,local_368);
  uVar10 = local_4f8;
  if (iVar4 != 0) {
    local_4f0 = (Integer *)(long)local_4f4;
    ndim = (long)(int)local_4f8;
    local_4e8 = local_4e8 << 3;
    do {
      __src = local_4c8;
      uVar11 = local_4e8;
      if (0 < (short)local_4f8) {
        memcpy(local_4a8,local_4d0,local_4e8);
        memcpy(local_428,__src,uVar11);
      }
      IVar5 = gai_correct_strided_patch(ndim,local_4e0,skip,local_4a8,local_428);
      if (IVar5 != 0) {
        if ((short)local_4f8 < 1) {
          lVar12 = 0;
        }
        else {
          lVar12 = 0;
          lVar7 = 0;
          lVar8 = 1;
          do {
            lVar9 = lVar8;
            if (lVar7 < ndim + -1) {
              lVar9 = local_368[lVar7] * lVar8;
            }
            lVar12 = lVar12 + (local_4a8[lVar7] - local_4d0[lVar7]) * lVar8;
            lVar7 = lVar7 + 1;
            lVar8 = lVar9;
          } while (ndim != lVar7);
        }
        dst_ptr = local_4d8 + lVar12 * (long)local_4f0;
        lVar12 = (local_4a8[0] - *local_4e0) / *skip;
        if (1 < (short)uVar10) {
          lVar8 = 0;
          do {
            lVar3 = lVar8 + 1;
            lVar7 = lVar8 + 1;
            lVar9 = lVar8 + 1;
            plVar1 = ld + lVar8;
            lVar8 = lVar8 + 1;
            lVar12 = lVar12 + ((local_4a8[lVar3] - local_4e0[lVar7]) / skip[lVar9]) * *plVar1;
          } while (ndim + -1 != lVar8);
        }
        local_4d8 = dst_ptr;
        iVar4 = gai_ComputeCountWithSkip
                          (ndim,local_4a8,local_428,skip,local_3a8,(Integer *)local_4b0);
        if (iVar4 != 0) {
          local_3a8[0] = local_3a8[0] * local_4f4;
          local_3e8 = local_4f4;
          local_468[0] = local_4f4;
          if (0 < (short)uVar10) {
            lVar8 = 0;
            iVar4 = local_4f4;
            iVar6 = local_4f4;
            do {
              local_468[lVar8 + 1] = iVar6;
              local_468[lVar8] = (int)skip[lVar8] * iVar6;
              iVar6 = iVar6 * (int)local_368[lVar8];
              local_468[lVar8 + 1] = iVar6;
              aiStack_3e4[lVar8] = iVar4;
              iVar4 = iVar4 * (int)ld[lVar8];
              aiStack_3e4[lVar8] = iVar4;
              lVar8 = lVar8 + 1;
            } while (ndim != lVar8);
          }
          if ((int)local_4c0 != -1) {
            local_4fc = PGRP_LIST[local_4c0].inv_map_proc_list[local_4fc];
          }
          ARMCI_PutS((void *)(lVar12 * (long)local_4f0 + (long)local_4b8),&local_3e8,dst_ptr,
                     local_468,local_3a8,local_4b0[0] + -1,local_4fc);
        }
      }
      iVar4 = gai_iterator_next(&local_330,&local_4fc,&local_4d0,&local_4c8,&local_4d8,local_368);
    } while (iVar4 != 0);
  }
  gai_iterator_destroy(&local_330);
  return;
}

Assistant:

void pnga_strided_put(Integer g_a, Integer *lo, Integer *hi, Integer *skip,
                     void    *buf, Integer *ld)
{
  /* g_a:    Global Array handle
     lo[]:   Array of lower indices of patch of global array
     hi[]:   Array of upper indices of patch of global array
     skip[]: Array of skips for each dimension
     buf[]:  Local buffer that patch will be copied from
     ld[]:   ndim-1 physical dimensions of local buffer */
  Integer p, np=0, handle = GA_OFFSET + g_a;
  Integer idx, size, nstride, p_handle, nproc;
  Integer ldrem[MAXDIM];
  Integer idx_buf, *blo, *bhi;
  Integer plo[MAXDIM],phi[MAXDIM];
  char *pbuf, *prem;
  int count[2*MAXDIM], stride_rem[2*MAXDIM], stride_loc[2*MAXDIM];
  int i, proc, ndim;
  _iterator_hdl it_hdl;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  nproc = pnga_nnodes();
  p_handle = GA[handle].p_handle;

  /* check values of skips to make sure they are legitimate */
  for (i = 0; i<ndim; i++) {
    if (skip[i]<1) {
      pnga_error("nga_strided_put: Invalid value of skip along coordinate ",i);
    }
  }

  gai_iterator_init(g_a, lo, hi, &it_hdl);
  while (gai_iterator_next(&it_hdl, &proc, &blo, &bhi, &prem, ldrem)) {
      /* Correct ranges to account for skips in original patch. If no
         data is left in patch jump to next processor in loop. */
      for (i=0; i<ndim; i++) {
        plo[i] = blo[i];
        phi[i] = bhi[i];
      }
      if (!gai_correct_strided_patch((Integer)ndim, lo, skip, plo, phi))
        continue;
      /* May need to correct location of remote buffer */
      gai_FindOffset(ndim,blo,plo,ldrem,&idx_buf);
      prem += size*idx_buf;

      /* get pointer in local buffer to point indexed by plo given that
         the corner of the buffer corresponds to the point indexed by lo */
      gai_ComputePatchIndexWithSkip(ndim, lo, plo, skip, ld, &idx_buf);
      pbuf = size*idx_buf + (char*)buf;

      /* Compute number of elements in each stride region and compute the
         number of stride regions. Store the results in count and nstride */
      if (!gai_ComputeCountWithSkip(ndim, plo, phi, skip, count, &nstride))
        continue;

      /* Scale first element in count by element size. The ARMCI_PutS routine
         uses this convention to figure out memory sizes. */
      count[0] *= size;

      /* Calculate strides in memory for remote processor indexed by proc and
         local buffer */ 
      gai_SetStrideWithSkip(ndim, size, ld, ldrem, stride_rem, stride_loc,
          skip);

      /* BJP */
      if (p_handle != -1) {
        proc = PGRP_LIST[p_handle].inv_map_proc_list[proc];
      }
      ARMCI_PutS(pbuf, stride_loc, prem, stride_rem, count, nstride-1, proc);
  }
  gai_iterator_destroy(&it_hdl);
}